

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_api.cc
# Opt level: O0

int XLearnCV(XL *out)

{
  HyperParam *pHVar1;
  Solver *this;
  undefined8 *in_RDI;
  float fVar2;
  Solver *in_stack_00000030;
  Solver *in_stack_00000040;
  runtime_error *_except_;
  XLearn *xl;
  Timer timer;
  undefined7 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5f;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  string local_58 [32];
  XLearn *local_38;
  undefined8 *local_10;
  
  local_10 = in_RDI;
  Timer::Timer((Timer *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
  Timer::tic((Timer *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
  local_38 = (XLearn *)*local_10;
  pHVar1 = XLearn::GetHyperParam(local_38);
  pHVar1->cross_validation = true;
  pHVar1 = XLearn::GetHyperParam(local_38);
  pHVar1->is_train = true;
  XLearn::GetSolver(local_38);
  XLearn::GetHyperParam(local_38);
  xLearn::Solver::Initialize
            ((Solver *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
             (HyperParam *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
  XLearn::GetSolver(local_38);
  xLearn::Solver::StartWork(in_stack_00000040);
  this = XLearn::GetSolver(local_38);
  xLearn::Solver::Clear(in_stack_00000030);
  pHVar1 = XLearn::GetHyperParam(local_38);
  pHVar1->cross_validation = false;
  fVar2 = Timer::toc((Timer *)this);
  StringPrintf_abi_cxx11_((char *)(double)fVar2,local_58,"Total time cost: %.2f (sec)");
  Color::print_info((string *)CONCAT44(fVar2,in_stack_ffffffffffffff60),
                    (bool)in_stack_ffffffffffffff5f);
  std::__cxx11::string::~string(local_58);
  return 0;
}

Assistant:

XL_DLL int XLearnCV(XL *out) {
  API_BEGIN();
  Timer timer;
  timer.tic();
  XLearn* xl = reinterpret_cast<XLearn*>(*out);
  xl->GetHyperParam().cross_validation = true;
  xl->GetHyperParam().is_train = true;
  xl->GetSolver().Initialize(xl->GetHyperParam());
  xl->GetSolver().StartWork();
  xl->GetSolver().Clear();
  xl->GetHyperParam().cross_validation = false;
  Color::print_info(
    StringPrintf("Total time cost: %.2f (sec)", 
    timer.toc()), true);
  API_END();
}